

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

bool __thiscall Json::StyledWriter::isMultilineArray(StyledWriter *this,Value *value)

{
  ArrayIndex AVar1;
  Value *pVVar2;
  ArrayIndex index;
  ArrayIndex index_00;
  long lVar3;
  uint uVar4;
  byte bVar5;
  bool bVar6;
  ArrayIndex index_1;
  ulong uVar7;
  bool bVar8;
  
  AVar1 = Value::size(value);
  bVar8 = this->rightMargin_ <= AVar1 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  index_00 = 0;
  do {
    if ((AVar1 <= index_00) || (bVar8)) {
      bVar6 = true;
      if (!bVar8) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&this->childValues_,(ulong)AVar1);
        this->addChildValues_ = true;
        uVar4 = AVar1 * 2 + 2;
        lVar3 = 8;
        bVar5 = 0;
        for (uVar7 = 0; AVar1 != uVar7; uVar7 = uVar7 + 1) {
          pVVar2 = Value::operator[](value,(ArrayIndex)uVar7);
          bVar8 = hasCommentForValue(pVVar2);
          bVar5 = bVar5 | bVar8;
          pVVar2 = Value::operator[](value,(ArrayIndex)uVar7);
          writeValue(this,pVVar2);
          uVar4 = uVar4 + *(int *)((long)&(((this->childValues_).
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                          ._M_p + lVar3);
          lVar3 = lVar3 + 0x20;
        }
        this->addChildValues_ = false;
        bVar6 = (bool)(bVar5 | this->rightMargin_ <= uVar4);
      }
      return bVar6;
    }
    pVVar2 = Value::operator[](value,index_00);
    bVar8 = Value::isArray(pVVar2);
    if (bVar8) {
LAB_00161a2a:
      bVar8 = Value::empty(pVVar2);
      bVar8 = !bVar8;
    }
    else {
      bVar8 = Value::isObject(pVVar2);
      if (bVar8) goto LAB_00161a2a;
      bVar8 = false;
    }
    index_00 = index_00 + 1;
  } while( true );
}

Assistant:

bool StyledWriter::isMultilineArray(const Value& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                   !childValue.empty());
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}